

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O2

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,Point2 *pred,
          Point2 *corr)

{
  int *t;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  int *in_RCX;
  int iVar6;
  ulong uVar7;
  undefined1 local_70 [24];
  int *local_58;
  VectorD<int,_2> local_50;
  Self local_48;
  VectorD<int,_2> local_40;
  VectorD<int,_2> local_38;
  
  local_48.v_._M_elems[0] = pred[2].v_._M_elems[0];
  local_58 = in_RCX;
  local_48.v_._M_elems[1] = local_48.v_._M_elems[0];
  VectorD<int,_2>::operator-(corr,&local_48);
  *(undefined8 *)(corr->v_)._M_elems = local_70._0_8_;
  iVar2 = (int)local_70._0_8_;
  iVar6 = -iVar2;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
  iVar5 = SUB84(local_70._0_8_,4);
  iVar2 = -iVar5;
  if (0 < iVar5) {
    iVar2 = iVar5;
  }
  t = (corr->v_)._M_elems + 1;
  local_70._12_4_ = pred[2].v_._M_elems[0];
  if ((uint)local_70._12_4_ < (uint)(iVar2 + iVar6)) {
    OctahedronToolBox::InvertDiamond((OctahedronToolBox *)pred,(int32_t *)corr,t);
  }
  local_70._16_8_ = t;
  bVar1 = PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::IsInBottomLeft
                    ((PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *)pred,corr);
  VectorD<int,_2>::VectorD(&local_38,corr);
  local_70._8_4_ =
       PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::GetRotationCount
                 ((PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *)pred,&local_38)
  ;
  if (bVar1) {
    uVar7 = (ulong)(uint)(corr->v_)._M_elems[0];
  }
  else {
    VectorD<int,_2>::VectorD(&local_50,corr);
    PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::RotatePoint
              ((PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *)local_70,pred,
               (int32_t)&local_50);
    *(undefined8 *)(corr->v_)._M_elems = local_70._0_8_;
    uVar7 = local_70._0_8_;
  }
  iVar3 = OctahedronToolBox::ModMax((OctahedronToolBox *)pred,(int)uVar7 + *local_58);
  iVar4 = OctahedronToolBox::ModMax((OctahedronToolBox *)pred,local_58[1] + *(int *)local_70._16_8_)
  ;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_ =
       iVar3;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_quantized_value_
       = iVar4;
  if (!bVar1) {
    VectorD<int,_2>::VectorD(&local_40,(Self *)this);
    PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::RotatePoint
              ((PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *)local_70,pred,
               (int32_t)&local_40);
    (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
    super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_
         = local_70._0_4_;
    (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
    super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
    max_quantized_value_ = local_70._4_4_;
  }
  if ((uint)local_70._12_4_ < (uint)(iVar2 + iVar6)) {
    OctahedronToolBox::InvertDiamond
              ((OctahedronToolBox *)pred,(int32_t *)this,
               &(this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
                super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
                max_quantized_value_);
  }
  VectorD<int,_2>::operator+((VectorD<int,_2> *)this,&local_48);
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.quantization_bits_ =
       local_70._0_4_;
  (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
  super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_quantized_value_
       = local_70._4_4_;
  return (Point2)(array<int,_2UL>)this;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, Point2 corr) const {
    const Point2 t(this->center_value(), this->center_value());
    pred = pred - t;
    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }
    const bool pred_is_in_bottom_left = this->IsInBottomLeft(pred);
    const int32_t rotation_count = this->GetRotationCount(pred);
    if (!pred_is_in_bottom_left) {
      pred = this->RotatePoint(pred, rotation_count);
    }
    Point2 orig(this->ModMax(AddAsUnsigned(pred[0], corr[0])),
                this->ModMax(AddAsUnsigned(pred[1], corr[1])));
    if (!pred_is_in_bottom_left) {
      const int32_t reverse_rotation_count = (4 - rotation_count) % 4;
      orig = this->RotatePoint(orig, reverse_rotation_count);
    }
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }
    orig = orig + t;
    return orig;
  }